

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::DescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  _func_int **pp_Var2;
  Arena *extraout_RDX;
  Arena *arena;
  uint unaff_EBP;
  string *value;
  MessageLite *pMVar3;
  Arena *arena_00;
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    pMVar3 = from_msg;
    MergeImpl();
    arena = extraout_RDX;
LAB_0020caa1:
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
LAB_0020c9ff:
    internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pMVar3,value,arena);
  }
  else {
    if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_,
                 Arena::CopyConstruct<google::protobuf::FieldDescriptorProto>);
    }
    if ((int)from_msg[3]._internal_metadata_.ptr_ != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)(to_msg + 3),(RepeatedPtrFieldBase *)(from_msg + 3),
                 Arena::CopyConstruct<google::protobuf::DescriptorProto>);
    }
    if (*(int *)&from_msg[5]._vptr_MessageLite != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[4]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[4]._internal_metadata_,
                 Arena::CopyConstruct<google::protobuf::EnumDescriptorProto>);
    }
    if ((int)from_msg[6]._internal_metadata_.ptr_ != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)(to_msg + 6),(RepeatedPtrFieldBase *)(from_msg + 6),
                 Arena::CopyConstruct<google::protobuf::DescriptorProto_ExtensionRange>);
    }
    if (*(int *)&from_msg[8]._vptr_MessageLite != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[7]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[7]._internal_metadata_,
                 Arena::CopyConstruct<google::protobuf::FieldDescriptorProto>);
    }
    if ((int)from_msg[9]._internal_metadata_.ptr_ != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)(to_msg + 9),(RepeatedPtrFieldBase *)(from_msg + 9),
                 Arena::CopyConstruct<google::protobuf::OneofDescriptorProto>);
    }
    if (*(int *)&from_msg[0xb]._vptr_MessageLite != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[10]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[10]._internal_metadata_,
                 Arena::CopyConstruct<google::protobuf::DescriptorProto_ReservedRange>);
    }
    if ((int)from_msg[0xc]._internal_metadata_.ptr_ != 0) {
      internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)(to_msg + 0xc),(RepeatedPtrFieldBase *)(from_msg + 0xc));
    }
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 7) == 0) goto LAB_0020ca4f;
    if ((unaff_EBP & 1) != 0) {
      uVar1 = from_msg[0xd]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      value = (string *)(uVar1 & 0xfffffffffffffffc);
      pMVar3 = (MessageLite *)&to_msg[0xd]._internal_metadata_;
      arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)arena & 1) != 0) goto LAB_0020caa1;
      goto LAB_0020c9ff;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    pMVar3 = (MessageLite *)from_msg[0xe]._vptr_MessageLite;
    if (pMVar3 == (MessageLite *)0x0) {
      MergeImpl((DescriptorProto *)&stack0xffffffffffffffd0);
    }
    if ((MessageLite *)to_msg[0xe]._vptr_MessageLite == (MessageLite *)0x0) {
      pp_Var2 = (_func_int **)
                Arena::CopyConstruct<google::protobuf::MessageOptions>(arena_00,pMVar3);
      to_msg[0xe]._vptr_MessageLite = pp_Var2;
    }
    else {
      MessageOptions::MergeImpl((MessageLite *)to_msg[0xe]._vptr_MessageLite,pMVar3);
    }
  }
  if ((unaff_EBP & 4) != 0) {
    *(int *)&to_msg[0xe]._internal_metadata_.ptr_ = (int)from_msg[0xe]._internal_metadata_.ptr_;
  }
LAB_0020ca4f:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void DescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<DescriptorProto*>(&to_msg);
  auto& from = static_cast<const DescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.DescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_field()->MergeFrom(
      from._internal_field());
  _this->_internal_mutable_nested_type()->MergeFrom(
      from._internal_nested_type());
  _this->_internal_mutable_enum_type()->MergeFrom(
      from._internal_enum_type());
  _this->_internal_mutable_extension_range()->MergeFrom(
      from._internal_extension_range());
  _this->_internal_mutable_extension()->MergeFrom(
      from._internal_extension());
  _this->_internal_mutable_oneof_decl()->MergeFrom(
      from._internal_oneof_decl());
  _this->_internal_mutable_reserved_range()->MergeFrom(
      from._internal_reserved_range());
  _this->_internal_mutable_reserved_name()->MergeFrom(from._internal_reserved_name());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.visibility_ = from._impl_.visibility_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}